

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketInitiator::doConnect(ThreadedSocketInitiator *this,SessionID *s,Dictionary *d)

{
  NullLog *pNVar1;
  bool bVar2;
  int iVar3;
  socket_handle s_00;
  Session *pSVar4;
  ThreadedSocketConnection *this_00;
  undefined8 *var;
  int value;
  int value_00;
  int value_01;
  NullLog *pLog;
  Log *pLVar5;
  thread_id thread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  HostDetails host;
  
  pSVar4 = Session::lookupSession(s);
  UtcTimeStamp::now();
  bVar2 = TimeRange::isInRange(&pSVar4->m_sessionTime,(UtcTimeStamp *)&host);
  if (bVar2) {
    HostDetailsProvider::getHost(&host,&this->m_hostDetailsProvider,s,d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&thread,"ReconnectInterval",(allocator<char> *)&local_1e0);
    bVar2 = Dictionary::has(d,(string *)&thread);
    std::__cxx11::string::~string((string *)&thread);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&thread,"ReconnectInterval",(allocator<char> *)&local_1e0);
      iVar3 = Dictionary::getInt(d,(string *)&thread);
      this->m_reconnectInterval = iVar3;
      std::__cxx11::string::~string((string *)&thread);
    }
    s_00 = socket_createConnector();
    if (this->m_noDelay == true) {
      socket_setsockopt(s_00,1);
    }
    if (this->m_sendBufSize != 0) {
      socket_setsockopt(s_00,7,this->m_sendBufSize);
    }
    if (this->m_rcvBufSize != 0) {
      socket_setsockopt(s_00,8,this->m_rcvBufSize);
    }
    Initiator::setPending(&this->super_Initiator,s);
    std::operator+(&local_160,"Connecting to ",&host.address);
    std::operator+(&local_140,&local_160," on port ");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_180,(IntTConvertor<int> *)(ulong)(ushort)host.port,value);
    std::operator+(&local_120,&local_140,&local_180);
    std::operator+(&local_100,&local_120," (Source ");
    std::operator+(&local_e0,&local_100,&host.sourceAddress);
    std::operator+(&local_c0,&local_e0,":");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_1a0,(IntTConvertor<int> *)(ulong)(ushort)host.sourcePort,value_00);
    std::operator+(&local_a0,&local_c0,&local_1a0);
    std::operator+(&local_1e0,&local_a0,") ReconnectInterval=");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_1c0,(IntTConvertor<int> *)(ulong)(uint)this->m_reconnectInterval,value_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&thread,
                   &local_1e0,&local_1c0);
    pLVar5 = &(pSVar4->m_state).super_Log;
    (*pLVar5->_vptr_Log[6])(pLVar5,&thread);
    std::__cxx11::string::~string((string *)&thread);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    this_00 = (ThreadedSocketConnection *)operator_new(0x20c8);
    pNVar1 = (NullLog *)(this->super_Initiator).m_pLog;
    pLog = &(this->super_Initiator).m_nullLog;
    if (pNVar1 != (NullLog *)0x0) {
      pLog = pNVar1;
    }
    ThreadedSocketConnection::ThreadedSocketConnection
              (this_00,s,s_00,&host.address,host.port,&pLog->super_Log,&host.sourceAddress,
               host.sourcePort);
    var = (undefined8 *)operator_new(0x10);
    *var = this;
    var[1] = this_00;
    Mutex::lock(&this->m_mutex);
    bVar2 = thread_spawn(socketThread,var,&thread);
    if (bVar2) {
      addThread(this,s_00,thread);
    }
    else {
      operator_delete(var,0x10);
      (*(this_00->super_Responder)._vptr_Responder[3])(this_00);
      (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
      Initiator::setDisconnected(&this->super_Initiator,s);
    }
    Mutex::unlock(&this->m_mutex);
    HostDetails::~HostDetails(&host);
  }
  return;
}

Assistant:

void ThreadedSocketInitiator::doConnect(const SessionID &s, const Dictionary &d) {
  try {
    Session *session = Session::lookupSession(s);
    if (!session->isSessionTime(UtcTimeStamp::now())) {
      return;
    }

    Log *log = session->getLog();

    HostDetails host = m_hostDetailsProvider.getHost(s, d);
    if (d.has(RECONNECT_INTERVAL)) // ReconnectInterval in [SESSION]
    {
      m_reconnectInterval = d.getInt(RECONNECT_INTERVAL);
    }

    socket_handle socket = socket_createConnector();
    if (m_noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (m_sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, m_sendBufSize);
    }
    if (m_rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, m_rcvBufSize);
    }

    setPending(s);
    log->onEvent(
        "Connecting to " + host.address + " on port " + IntConvertor::convert((unsigned short)host.port) + " (Source "
        + host.sourceAddress + ":" + IntConvertor::convert((unsigned short)host.sourcePort)
        + ") ReconnectInterval=" + IntConvertor::convert((int)m_reconnectInterval));

    ThreadedSocketConnection *pConnection = new ThreadedSocketConnection(
        s,
        socket,
        host.address,
        host.port,
        getLog(),
        host.sourceAddress,
        host.sourcePort);

    ThreadPair *pair = new ThreadPair(this, pConnection);

    {
      Locker l(m_mutex);
      thread_id thread;
      if (thread_spawn(&socketThread, pair, thread)) {
        addThread(socket, thread);
      } else {
        delete pair;
        pConnection->disconnect();
        delete pConnection;
        setDisconnected(s);
      }
    }
  } catch (std::exception &) {}
}